

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_> __thiscall
node::anon_unknown_2::MinerImpl::createNewBlock
          (MinerImpl *this,CScript *script_pub_key,BlockCreateOptions *options)

{
  long lVar1;
  undefined8 uVar2;
  ArgsManager **ppAVar3;
  ChainstateManager *this_00;
  Chainstate *chainstate;
  long lVar4;
  _func_int **pp_Var5;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  undefined1 local_140 [216];
  Options assemble_options;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  assemble_options.super_BlockCreateOptions.coinbase_output_max_additional_sigops = in_RCX[2];
  assemble_options.super_BlockCreateOptions._0_8_ = *in_RCX;
  assemble_options.super_BlockCreateOptions.coinbase_max_additional_weight = in_RCX[1];
  assemble_options.nBlockMaxWeight = (size_t)&LAB_003cf960;
  assemble_options.blockMinFeeRate.nSatoshisPerK = 1000;
  assemble_options.test_block_validity = true;
  assemble_options.print_modified_fee = false;
  ppAVar3 = inline_assertion_check<true,ArgsManager*&>
                      ((ArgsManager **)
                       (*(long *)((long)&(script_pub_key->super_CScriptBase)._union + 8) + 0x60),
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                       ,0x3da,"createNewBlock","m_node.args");
  ApplyArgsManOptions(*ppAVar3,&assemble_options);
  this_00 = chainman((MinerImpl *)script_pub_key);
  chainstate = ChainstateManager::ActiveChainstate(this_00);
  lVar4 = (**(code **)((script_pub_key->super_CScriptBase)._union.indirect_contents.indirect + 0x50)
          )(script_pub_key);
  BlockAssembler::BlockAssembler
            ((BlockAssembler *)(local_140 + 0x10),chainstate,*(CTxMemPool **)(lVar4 + 0x30),
             &assemble_options);
  BlockAssembler::CreateNewBlock((BlockAssembler *)local_140,(CScript *)(local_140 + 0x10));
  pp_Var5 = (_func_int **)operator_new(0x10);
  uVar2 = local_140._0_8_;
  local_140._0_8_ =
       (_Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)0x0;
  *pp_Var5 = (_func_int *)&PTR__BlockTemplateImpl_01144718;
  ((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)(pp_Var5 + 1))->
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> =
       (_Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)uVar2;
  local_140._8_8_ = 0;
  if ((_Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)uVar2 ==
      (CBlockTemplate *)0x0) {
    __assert_fail("m_block_template",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                  ,0x36b,
                  "node::(anonymous namespace)::BlockTemplateImpl::BlockTemplateImpl(std::unique_ptr<CBlockTemplate>)"
                 );
  }
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             (local_140 + 8));
  (this->super_Mining)._vptr_Mining = pp_Var5;
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             local_140);
  BlockAssembler::~BlockAssembler((BlockAssembler *)(local_140 + 0x10));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>,_true,_true>
            )(__uniq_ptr_data<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<BlockTemplate> createNewBlock(const CScript& script_pub_key, const BlockCreateOptions& options) override
    {
        BlockAssembler::Options assemble_options{options};
        ApplyArgsManOptions(*Assert(m_node.args), assemble_options);
        return std::make_unique<BlockTemplateImpl>(BlockAssembler{chainman().ActiveChainstate(), context()->mempool.get(), assemble_options}.CreateNewBlock(script_pub_key));
    }